

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str_size_t mctools_strlen(char *c_str,mcu8str_size_t nmax)

{
  int iVar1;
  void *pvVar2;
  mcu8str_size_t mVar3;
  char *pcVar4;
  char *extraout_RAX;
  size_t __n;
  undefined8 *puVar5;
  mcu8str *pmVar6;
  uint uVar7;
  
  __n = 0xffffffff;
  if (nmax != 0) {
    __n = nmax;
  }
  if ((long)__n < 0) {
    mctools_strlen_cold_2();
  }
  else {
    nmax = 0;
    pmVar6 = (mcu8str *)c_str;
    pvVar2 = memchr(c_str,0,__n);
    mVar3 = (long)pvVar2 - (long)c_str;
    if (pvVar2 == (void *)0x0) {
      mVar3 = __n;
    }
    c_str = (char *)pmVar6;
    if (mVar3 < 0xfffffffe) {
      return mVar3;
    }
  }
  mctools_strlen_cold_1();
  if ((undefined8 *)nmax == (undefined8 *)0x0) {
    ((mcu8str *)c_str)->c_str = mcu8str_create_empty::dummy;
    ((mcu8str *)c_str)->size = 0;
    uVar7 = 0;
    iVar1 = 0;
  }
  else {
    puVar5 = (undefined8 *)nmax;
    if (nmax >> 1 < 0x7fffffff) {
      pmVar6 = (mcu8str *)(nmax + 1);
      pcVar4 = (char *)malloc((size_t)pmVar6);
    }
    else {
      pcVar4 = (char *)0x0;
      pmVar6 = (mcu8str *)c_str;
    }
    ((mcu8str *)c_str)->c_str = pcVar4;
    if (pcVar4 == (char *)0x0) {
      mcu8str_create_cold_1();
      pcVar4 = extraout_RAX;
      if (*(int *)(puVar5 + 1) != 0) {
        uVar7 = *(int *)(puVar5 + 1) + pmVar6->size;
        if (pmVar6->buflen <= uVar7) {
          mcu8str_reserve(pmVar6,(ulong)uVar7);
        }
        memcpy(pmVar6->c_str + pmVar6->size,(void *)*puVar5,(ulong)*(uint *)(puVar5 + 1));
        pcVar4 = pmVar6->c_str;
        pcVar4[uVar7] = '\0';
        pmVar6->size = uVar7;
      }
      return (mcu8str_size_t)pcVar4;
    }
    *pcVar4 = '\0';
    ((mcu8str *)c_str)->size = 0;
    uVar7 = (int)nmax + 1;
    iVar1 = 1;
  }
  ((mcu8str *)c_str)->buflen = uVar7;
  ((mcu8str *)c_str)->owns_memory = iVar1;
  return (mcu8str_size_t)(mcu8str *)c_str;
}

Assistant:

mcu8str_size_t mctools_strlen( const char * c_str, mcu8str_size_t nmax )
  {
    //safe strlen which guarantees result can fit in an unsigned integer (or
    //less, when 0<nmax<UINT_MAX is provided).
    if ( nmax == 0 )
      nmax = ( UINT_MAX > PTRDIFF_MAX ? PTRDIFF_MAX : UINT_MAX );

    if ( nmax > PTRDIFF_MAX )
      mctools_impl_error("str length out of range");

    const char * nullchr = (const char *) STDNS memchr( c_str, '\0', nmax );
    mcu8str_size_t o_size;
    if ( nullchr )
      o_size = nullchr - c_str;
    else
      o_size = nmax;
    if ( !MCTOOLS_STROKFORUINT(o_size) )
      mctools_impl_error("str length out of range");
    return o_size;
  }